

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O3

float S_GetRolloff(FRolloffInfo *rolloff,float distance,bool logarithmic)

{
  float fVar1;
  int iVar2;
  float fVar3;
  double dVar4;
  
  if (rolloff == (FRolloffInfo *)0x0) {
    return 0.0;
  }
  fVar3 = rolloff->MinDistance;
  if (distance <= fVar3) {
    return 1.0;
  }
  iVar2 = rolloff->RolloffType;
  fVar1 = (rolloff->field_2).MaxDistance;
  if (iVar2 == 2) {
    return fVar3 / (fVar1 * (distance - fVar3) + fVar3);
  }
  if (fVar1 <= distance) {
    return 0.0;
  }
  fVar3 = (fVar1 - distance) / (fVar1 - fVar3);
  if (iVar2 == 3 && S_SoundCurve != (BYTE *)0x0) {
    fVar3 = (float)S_SoundCurve[(int)((1.0 - fVar3) * (float)S_SoundCurveSize)] * 0.007874016;
    if (!logarithmic) {
      return fVar3;
    }
  }
  else {
    if (!logarithmic) {
      if (iVar2 != 1) {
        return fVar3;
      }
      dVar4 = log10((double)fVar3 * 9.0 + 1.0);
      goto LAB_002fed4f;
    }
    if (iVar2 == 1) {
      return fVar3;
    }
  }
  fVar3 = exp2f(fVar3 * 3.321928);
  dVar4 = (double)fVar3 * 0.1111111111111111 + -0.1111111111111111;
LAB_002fed4f:
  return (float)dVar4;
}

Assistant:

float S_GetRolloff(FRolloffInfo *rolloff, float distance, bool logarithmic)
{
	if (rolloff == NULL)
	{
		return 0;
	}

	if (distance <= rolloff->MinDistance)
	{
		return 1;
	}
	if (rolloff->RolloffType == ROLLOFF_Log)
	{ // Logarithmic rolloff has no max distance where it goes silent.
		return rolloff->MinDistance / (rolloff->MinDistance + rolloff->RolloffFactor * (distance - rolloff->MinDistance));
	}
	if (distance >= rolloff->MaxDistance)
	{
		return 0;
	}

	float volume = (rolloff->MaxDistance - distance) / (rolloff->MaxDistance - rolloff->MinDistance);
	if (rolloff->RolloffType == ROLLOFF_Custom && S_SoundCurve != NULL)
	{
		volume = S_SoundCurve[int(S_SoundCurveSize * (1 - volume))] / 127.f;
	}
	if (logarithmic)
	{
		if (rolloff->RolloffType == ROLLOFF_Linear)
		{
			return volume;
		}
		else
		{
			return float((powf(10.f, volume) - 1.) / 9.);
		}
	}
	else
	{
		if (rolloff->RolloffType == ROLLOFF_Linear)
		{
			return float(log10(9. * volume + 1.));
		}
		else
		{
			return volume;
		}
	}
}